

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockstreambuf_unbuffered.cpp
# Opt level: O0

int_type __thiscall
dlib::sockstreambuf_unbuffered::pbackfail(sockstreambuf_unbuffered *this,int_type c)

{
  int_type c_local;
  sockstreambuf_unbuffered *this_local;
  int_type local_4;
  
  if ((c == -1) || (c == this->lastread)) {
    if ((this->lastread_next & 1U) == 0) {
      this->lastread_next = true;
      local_4 = 1;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

sockstreambuf_unbuffered::int_type sockstreambuf_unbuffered::
    pbackfail(
        int_type c
    )
    {  
        // if they are trying to push back a character that they didn't read last
        // that is an error
        if (c != EOF && c != lastread)
            return EOF;

        // if they are trying to push back a second character then thats an error
        if (lastread_next)
            return EOF;

        lastread_next = true;
        return 1;
    }